

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewLogger(PosixEnv *this,string *fname,Logger **result)

{
  FILE *pFVar1;
  undefined8 *puVar2;
  undefined8 *in_RCX;
  
  pFVar1 = fopen((char *)*result,"w");
  if (pFVar1 == (FILE *)0x0) {
    *in_RCX = 0;
    __errno_location();
    IOError((string *)this,(int)*result);
  }
  else {
    puVar2 = (undefined8 *)operator_new(0x18);
    *puVar2 = &PTR__PosixLogger_00132d78;
    puVar2[1] = pFVar1;
    puVar2[2] = gettid;
    *in_RCX = puVar2;
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status NewLogger(const std::string &fname, Logger **result) {
                FILE *f = fopen(fname.c_str(), "w");
                if (f == NULL) {
                    *result = NULL;
                    return IOError(fname, errno);
                } else {
                    *result = new PosixLogger(f, &PosixEnv::gettid);
                    return Status::OK();
                }
            }